

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O1

int adh_compress_file(char *input_file_name,char *output_file_name)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  FILE *output_file_ptr;
  FILE *input_file_ptr;
  byte_t input_buffer [1024];
  byte_t output_buffer [1024];
  FILE *local_848;
  FILE *local_840;
  byte_t local_838 [1024];
  byte_t local_438 [1032];
  
  log_info("adh_compress_file","%-40s %s\n",input_file_name,output_file_name);
  iVar1 = adh_init(input_file_name,output_file_name,(FILE **)&local_848,(FILE **)&local_840);
  if (iVar1 == 0) {
    memset(local_438,0,0x400);
    memset(local_838,0,0x400);
    out_bit_idx = 3;
    is_first_byte = 0;
    do {
      sVar3 = fread(local_838,1,0x400,local_840);
      if (sVar3 == 0) {
        iVar1 = flush_data(local_438,(FILE *)local_848);
        if (iVar1 == 0) {
          print_final_stats((FILE *)local_840,(FILE *)local_848);
          fclose(local_848);
          local_848 = (FILE *)bin_open_update(output_file_name);
          if (local_848 == (FILE *)0x0) {
            iVar1 = 0;
          }
          else {
            iVar1 = flush_header((FILE *)local_848);
          }
        }
        goto LAB_001014c3;
      }
      sVar4 = 0;
      do {
        iVar1 = process_symbol(local_838[sVar4],local_438,(FILE *)local_848);
        if (iVar1 != 0) {
          iVar2 = 2;
          goto LAB_00101571;
        }
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
      iVar2 = 5;
      iVar1 = 0;
LAB_00101571:
    } while (iVar2 == 5);
    if (iVar2 != 2) {
      return iVar1;
    }
  }
LAB_001014c3:
  adh_release((FILE *)local_848,(FILE *)local_840);
  return iVar1;
}

Assistant:

int adh_compress_file(const char input_file_name[], const char output_file_name[]) {
    log_info("adh_compress_file", "%-40s %s\n", input_file_name, output_file_name);

    FILE *output_file_ptr, *input_file_ptr;
    int rc = adh_init(input_file_name, output_file_name, &output_file_ptr, &input_file_ptr);
    if (rc != RC_OK) goto error_handling;

    byte_t output_buffer[BUFFER_SIZE] = {0};
    byte_t input_buffer[BUFFER_SIZE] = {0};

    // reserve first 3 bits for header
    out_bit_idx = HEADER_BITS;
    is_first_byte = true;

    size_t bytesRead = 0;
    while ((bytesRead = fread(input_buffer, sizeof(byte_t), BUFFER_SIZE, input_file_ptr)) > 0)
    {
        for(int i=0;i<bytesRead;i++) {
            rc = process_symbol(input_buffer[i], output_buffer, output_file_ptr);
            if (rc != RC_OK) goto error_handling;
        }
    }

    // flush remaining data to file
    rc = flush_data(output_buffer, output_file_ptr);
    if (rc != RC_OK) goto error_handling;

    print_final_stats(input_file_ptr, output_file_ptr);

    // close and reopen in update mode
    fclose(output_file_ptr);
    output_file_ptr = bin_open_update(output_file_name);
    if (output_file_ptr == NULL) goto error_handling;

    rc = flush_header(output_file_ptr);

error_handling:
    adh_release(output_file_ptr, input_file_ptr);

    return rc;
}